

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

bool tcu::astc::anon_unknown_0::isValidBlockParams
               (NormalBlockParams *params,int blockWidth,int blockHeight)

{
  bool bVar1;
  int numValues;
  int x;
  int iVar2;
  int iVar3;
  deInt32 dVar4;
  bool local_29;
  int numBitsForColorEndpoints;
  int numColorEndpointValues;
  int numWeightBits;
  int numWeights;
  int blockHeight_local;
  int blockWidth_local;
  NormalBlockParams *params_local;
  
  numValues = computeNumWeights(params);
  x = computeNumRequiredBits(&params->weightISEParams,numValues);
  iVar2 = computeNumColorEndpointValues
                    (params->colorEndpointModes,params->numPartitions,
                     (bool)(params->isMultiPartSingleCemMode & 1));
  iVar3 = computeNumBitsForColorEndpoints(params);
  local_29 = false;
  if (numValues < 0x41) {
    bVar1 = de::inRange<int>(x,0x18,0x60);
    local_29 = false;
    if ((((bVar1) && (local_29 = false, params->weightGridWidth <= blockWidth)) &&
        (local_29 = false, params->weightGridHeight <= blockHeight)) &&
       (((params->numPartitions != 4 || (local_29 = false, (params->isDualPlane & 1U) == 0)) &&
        (local_29 = false, iVar2 < 0x13)))) {
      dVar4 = deDivRoundUp32(iVar2 * 0xd,5);
      local_29 = dVar4 <= iVar3;
    }
  }
  return local_29;
}

Assistant:

static inline bool isValidBlockParams (const NormalBlockParams& params, int blockWidth, int blockHeight)
{
	const int numWeights				= computeNumWeights(params);
	const int numWeightBits				= computeNumRequiredBits(params.weightISEParams, numWeights);
	const int numColorEndpointValues	= computeNumColorEndpointValues(&params.colorEndpointModes[0], params.numPartitions, params.isMultiPartSingleCemMode);
	const int numBitsForColorEndpoints	= computeNumBitsForColorEndpoints(params);

	return numWeights <= 64										&&
		   de::inRange(numWeightBits, 24, 96)					&&
		   params.weightGridWidth <= blockWidth					&&
		   params.weightGridHeight <= blockHeight				&&
		   !(params.numPartitions == 4 && params.isDualPlane)	&&
		   numColorEndpointValues <= 18							&&
		   numBitsForColorEndpoints >= deDivRoundUp32(13*numColorEndpointValues, 5);
}